

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

void llvm::APInt::tcSetLeastSignificantBits(WordType *dst,uint parts,uint bits)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar13;
  undefined1 auVar12 [16];
  int iVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  
  uVar4 = 0;
  if (0x40 < bits) {
    uVar4 = bits - 0x41 >> 6;
    memset(dst,0xff,(ulong)(uVar4 * 8 + 8));
    auVar12._4_4_ = 0;
    auVar12._0_4_ = uVar4;
    auVar12._8_4_ = uVar4;
    auVar12._12_4_ = 0;
    lVar2 = 4;
    uVar7 = 0;
    uVar9 = 0;
    uVar11 = 0;
    do {
      uVar10 = uVar11;
      uVar8 = uVar9;
      uVar6 = uVar7;
      uVar5 = bits;
      bits = uVar5 - 0x40;
      uVar7 = uVar6 - 0x40;
      uVar9 = uVar8 - 0x40;
      uVar11 = uVar10 - 0x40;
      lVar1 = (ulong)(uVar4 + 4 & 0xfffffffc) + lVar2;
      lVar2 = lVar2 + -4;
    } while (lVar1 != 8);
    lVar2 = -lVar2;
    auVar16._8_4_ = (int)lVar2;
    auVar16._0_8_ = lVar2;
    auVar16._12_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar12 = auVar12 | _DAT_001954a0;
    auVar15 = (auVar16 | _DAT_001a5360) ^ _DAT_001954a0;
    iVar13 = auVar12._4_4_;
    iVar14 = auVar12._12_4_;
    auVar16 = (_DAT_00195490 | auVar16) ^ _DAT_001954a0;
    uVar17 = -(uint)(iVar13 < auVar16._4_4_ ||
                    auVar16._4_4_ == iVar13 && auVar12._0_4_ < auVar16._0_4_);
    uVar18 = -(uint)(iVar14 < auVar16._12_4_ ||
                    auVar16._12_4_ == iVar14 && auVar12._8_4_ < auVar16._8_4_);
    uVar19 = -(uint)(iVar13 < auVar15._4_4_ ||
                    auVar15._4_4_ == iVar13 && auVar12._0_4_ < auVar15._0_4_);
    uVar20 = -(uint)(iVar14 < auVar15._12_4_ ||
                    auVar15._12_4_ == iVar14 && auVar12._8_4_ < auVar15._8_4_);
    bits = (~uVar20 & uVar11 | uVar10 & uVar20) + (~uVar18 & uVar7 | uVar6 & uVar18) +
           (~uVar19 & uVar9 | uVar8 & uVar19) + (~uVar17 & bits | uVar5 & uVar17);
    uVar4 = uVar4 + 1;
  }
  if (bits != 0) {
    uVar3 = (ulong)uVar4;
    uVar4 = uVar4 + 1;
    dst[uVar3] = 0xffffffffffffffff >> (-(char)bits & 0x3fU);
  }
  if (uVar4 < parts) {
    memset(dst + uVar4,0,(ulong)(~uVar4 + parts) * 8 + 8);
    return;
  }
  return;
}

Assistant:

void APInt::tcSetLeastSignificantBits(WordType *dst, unsigned parts,
                                      unsigned bits) {
  unsigned i = 0;
  while (bits > APINT_BITS_PER_WORD) {
    dst[i++] = ~(WordType) 0;
    bits -= APINT_BITS_PER_WORD;
  }

  if (bits)
    dst[i++] = ~(WordType) 0 >> (APINT_BITS_PER_WORD - bits);

  while (i < parts)
    dst[i++] = 0;
}